

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O3

float plutovg_canvas_clip_text
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                float x,float y)

{
  float fVar1;
  
  plutovg_path_reset(canvas->path);
  fVar1 = plutovg_canvas_add_text(canvas,text,length,encoding,x,y);
  plutovg_canvas_clip_preserve(canvas);
  plutovg_path_reset(canvas->path);
  return fVar1;
}

Assistant:

float plutovg_canvas_clip_text(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, float x, float y)
{
    plutovg_canvas_new_path(canvas);
    float advance_width = plutovg_canvas_add_text(canvas, text, length, encoding, x, y);
    plutovg_canvas_clip(canvas);
    return advance_width;
}